

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Expression * __thiscall wasm::DataFlow::Graph::makeUse(Graph *this,Node *node)

{
  Module *pMVar1;
  size_t sVar2;
  char *pcVar3;
  anon_union_8_3_b615221d_for_Node_2 aVar4;
  Expression *pEVar5;
  Const *pCVar6;
  iterator iVar7;
  Type TVar8;
  int *piVar9;
  Index index;
  Literal local_68;
  Builder local_50;
  Builder builder;
  
  pMVar1 = this->module;
  local_50.wasm = pMVar1;
  switch(node->type) {
  case Var:
    sVar2 = (this->FAKE_CALL).super_IString.str._M_len;
    pcVar3 = (this->FAKE_CALL).super_IString.str._M_str;
    builder.wasm = (Module *)0x0;
    aVar4 = node->field_1;
    pEVar5 = (Expression *)MixedArena::allocSpace(&pMVar1->allocator,0x48,8);
    pEVar5->_id = CallId;
    *(undefined8 *)(pEVar5 + 1) = 0;
    *(undefined8 *)((long)(pEVar5 + 1) + 8) = 0;
    *(undefined8 *)(pEVar5 + 2) = 0;
    ((Type *)((long)(pEVar5 + 2) + 8))->id = (uintptr_t)&pMVar1->allocator;
    *(undefined1 *)(pEVar5 + 4) = 0;
    pEVar5->type = (Type)aVar4;
    *(size_t *)(pEVar5 + 3) = sVar2;
    *(char **)((long)(pEVar5 + 3) + 8) = pcVar3;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar5 + 1),
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
    *(undefined1 *)(pEVar5 + 4) = 0;
    if (builder.wasm == (Module *)0x0) {
      return pEVar5;
    }
    operator_delete(builder.wasm,-(long)builder.wasm);
    return pEVar5;
  case Expr:
    if (((node->field_1).expr)->_id == ConstId) {
      Literal::Literal(&local_68,(Literal *)((node->field_1).expr + 1));
      pCVar6 = Builder::makeConst(&local_50,&local_68);
      Literal::~Literal(&local_68);
      return (Expression *)pCVar6;
    }
    builder.wasm = (Module *)node;
    iVar7 = std::
            _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->nodeParentMap)._M_h,(key_type *)&builder);
    piVar9 = (int *)0x0;
    if (**(int **)((long)iVar7.
                         super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>
                         ._M_cur + 0x10) == 9) {
      piVar9 = *(int **)((long)iVar7.
                               super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>
                               ._M_cur + 0x10);
    }
    index = piVar9[4];
    break;
  case Phi:
    index = (node->field_1).index;
    break;
  default:
    handle_unreachable("unexpected node type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                       ,0x317);
  case Zext:
    pEVar5 = makeUse(this,*(node->values).
                           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    return pEVar5;
  }
  TVar8 = Function::getLocalType(this->func,index);
  pEVar5 = (Expression *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
  pEVar5->_id = LocalGetId;
  pEVar5[1]._id = index;
  pEVar5->type = (Type)TVar8.id;
  return pEVar5;
}

Assistant:

Expression* makeUse(Node* node) {
    Builder builder(*module);
    if (node->isPhi()) {
      // The index is the wasm local that we assign to when implementing
      // the phi; get from there.
      auto index = node->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isConst()) {
      return builder.makeConst(node->expr->cast<Const>()->value);
    } else if (node->isExpr()) {
      // Find the set we are a value of.
      auto index = getSet(node)->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isZext()) {
      // i1 zexts are a no-op for wasm
      return makeUse(node->values[0]);
    } else if (node->isVar()) {
      // Nothing valid for us to read here. Emit a call, representing an unknown
      // variable value.
      return Builder(*module).makeCall(FAKE_CALL, {}, node->wasmType);
    } else {
      WASM_UNREACHABLE("unexpected node type"); // TODO
    }
  }